

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int ASigil::GiveSigilPiece(AActor *receiver)

{
  ASigil *pAVar1;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  FName local_24;
  ASigil *local_20;
  ASigil *sigil;
  AActor *receiver_local;
  
  sigil = (ASigil *)receiver;
  local_20 = AActor::FindInventory<ASigil>(receiver);
  if (local_20 == (ASigil *)0x0) {
    FName::FName(&local_24,"Sigil1");
    local_20 = (ASigil *)Spawn(&local_24);
    bVar2 = AInventory::CallTryPickup((AInventory *)local_20,(AActor *)sigil,(AActor **)0x0);
    if (!bVar2) {
      (*(((AActor *)&local_20->super_AWeapon)->super_DThinker).super_DObject._vptr_DObject[4])();
    }
    receiver_local._4_4_ = 0;
  }
  else if (*(int *)&(local_20->super_AWeapon).field_0x584 < 5) {
    *(int *)&(local_20->super_AWeapon).field_0x584 =
         *(int *)&(local_20->super_AWeapon).field_0x584 + 1;
    iVar3 = MAX<int>(0,*(int *)&(local_20->super_AWeapon).field_0x584 + -1);
    pAVar4 = GetDefaultByName(GiveSigilPiece::sigils[iVar3]);
    (local_20->super_AWeapon).super_AInventory.Icon.texnum =
         *(int *)&pAVar4[1].super_DThinker.super_DObject.GCNext;
    pAVar4 = TObjPtr<AActor>::operator->(&(local_20->super_AWeapon).super_AInventory.Owner);
    if (pAVar4->player != (player_t *)0x0) {
      pAVar4 = TObjPtr<AActor>::operator->(&(local_20->super_AWeapon).super_AInventory.Owner);
      pAVar1 = local_20;
      if ((ASigil *)pAVar4->player->ReadyWeapon == local_20) {
        pAVar4 = TObjPtr<AActor>::operator->(&(local_20->super_AWeapon).super_AInventory.Owner);
        pAVar4->player->PendingWeapon = &pAVar1->super_AWeapon;
        local_20->DownPieces = *(int *)&(local_20->super_AWeapon).field_0x584 + -1;
      }
    }
    receiver_local._4_4_ = *(int *)&(local_20->super_AWeapon).field_0x584 + -1;
  }
  else {
    receiver_local._4_4_ = 5;
  }
  return receiver_local._4_4_;
}

Assistant:

int ASigil::GiveSigilPiece (AActor *receiver)
{
	ASigil *sigil;

	sigil = receiver->FindInventory<ASigil> ();
	if (sigil == NULL)
	{
		sigil = static_cast<ASigil*>(Spawn("Sigil1"));
		if (!sigil->CallTryPickup (receiver))
		{
			sigil->Destroy ();
		}
		return 0;
	}
	else if (sigil->NumPieces < 5)
	{
		++sigil->NumPieces;
		static const char* sigils[5] =
		{
			"Sigil1", "Sigil2", "Sigil3", "Sigil4", "Sigil5"
		};
		sigil->Icon = ((AInventory*)GetDefaultByName (sigils[MAX(0,sigil->NumPieces-1)]))->Icon;
		// If the player has the Sigil out, drop it and bring it back up.
		if (sigil->Owner->player != NULL && sigil->Owner->player->ReadyWeapon == sigil)
		{
			sigil->Owner->player->PendingWeapon = sigil;
			sigil->DownPieces = sigil->NumPieces - 1;
		}
		return sigil->NumPieces - 1;
	}
	else
	{
		return 5;
	}
}